

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ClockingSequenceExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingSequenceExprSyntax,slang::syntax::TimingControlSyntax&,slang::syntax::SequenceExprSyntax&>
          (BumpAllocator *this,TimingControlSyntax *args,SequenceExprSyntax *args_1)

{
  ClockingSequenceExprSyntax *pCVar1;
  
  pCVar1 = (ClockingSequenceExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ClockingSequenceExprSyntax *)this->endPtr < pCVar1 + 1) {
    pCVar1 = (ClockingSequenceExprSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pCVar1 + 1);
  }
  (pCVar1->super_SequenceExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar1->super_SequenceExprSyntax).super_SyntaxNode.kind = ClockingSequenceExpr;
  (pCVar1->event).ptr = args;
  (pCVar1->expr).ptr = args_1;
  (args->super_SyntaxNode).parent = (SyntaxNode *)pCVar1;
  (args_1->super_SyntaxNode).parent = (SyntaxNode *)pCVar1;
  return pCVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }